

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O2

void ST::format_type(format_spec *format,format_writer *output,wchar_t *wtext)

{
  char_buffer utf8;
  buffer<char> local_40;
  
  if (wtext != (wchar_t *)0x0) {
    string::from_wchar((string *)&local_40,wtext,0xffffffffffffffff,check_validity);
    string::to_utf8(&utf8,(string *)&local_40);
    buffer<char>::~buffer(&local_40);
    format_string(format,output,utf8.m_chars,utf8.m_size,align_left);
    buffer<char>::~buffer(&utf8);
  }
  return;
}

Assistant:

inline void format_type(const ST::format_spec &format, ST::format_writer &output,
                            const wchar_t *wtext)
    {
        if (wtext) {
            ST::char_buffer utf8 = ST::string::from_wchar(wtext).to_utf8();
            ST::format_string(format, output, utf8.data(), utf8.size());
        }
    }